

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAddEaRg<(moira::Instr)118,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(opcode >> 9 & 7);
  uVar1 = addsub<(moira::Instr)118,(moira::Size)4>
                    (this,*(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58),
                     *(u32 *)((long)this->exec + uVar2 * 4 + -0x58));
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,4);
  *(u32 *)((long)this->exec + uVar2 * 4 + -0x58) = uVar1;
  return;
}

Assistant:

void
Moira::execAddEaRg(u16 opcode)
{
    u32 ea, data, result;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    
    result = addsub<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();
    
    if (S == Long) sync(2 + (isMemMode(M) ? 0 : 2));
    writeD<S>(dst, result);
}